

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

void __thiscall CTcEmbedTokenList::add_tok(CTcEmbedTokenList *this,CTcToken *tok)

{
  CTcTokenEle *pCVar1;
  CTcTokenEle *pCVar2;
  
  CTcTokenizer::copytok(G_tok,&this->wrt->super_CTcToken,tok);
  pCVar1 = this->wrt;
  pCVar2 = pCVar1->nxt_;
  if (pCVar2 == (CTcTokenEle *)0x0) {
    pCVar2 = (CTcTokenEle *)operator_new(0x38);
    pCVar2->nxt_ = (CTcTokenEle *)0x0;
    pCVar2->prv_ = pCVar1;
    pCVar1->nxt_ = pCVar2;
    pCVar2 = this->wrt->nxt_;
  }
  this->wrt = pCVar2;
  this->cnt = this->cnt + 1;
  return;
}

Assistant:

void add_tok(const CTcToken *tok)
    {
        /* fill in the write token */
        G_tok->copytok(wrt, tok);

        /* if this is the last item in the list, add another */
        if (wrt->getnxt() == 0)
        {
            CTcTokenEle *ele = new CTcTokenEle();
            ele->setprv(wrt);
            wrt->setnxt(ele);
        }

        /* advance the write pointer */
        wrt = wrt->getnxt();

        /* count it */
        ++cnt;
    }